

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O3

void ParseConstant(FScanner *sc,PSymbolTable *symt,PClassActor *cls)

{
  PString *pPVar1;
  PInt *pPVar2;
  PFloat *pPVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FxExpression *pFVar8;
  DObject *this;
  PSymbol *pPVar9;
  char *pcVar10;
  FString FVar11;
  ExpVal val;
  FString local_38;
  
  bVar4 = FScanner::CheckToken(sc,0x13a);
  if ((bVar4) || (bVar4 = FScanner::CheckToken(sc,0x133), bVar4)) {
    iVar7 = sc->TokenType;
    FScanner::MustGetToken(sc,0x101);
    iVar5 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
    FScanner::MustGetToken(sc,0x3d);
    pFVar8 = ParseExpression(sc,cls,true);
    FScanner::MustGetToken(sc,0x3b);
    if (pFVar8 == (FxExpression *)0x0) {
      pcVar10 = "Error while resolving constant definition";
    }
    else {
      iVar6 = (*pFVar8->_vptr_FxExpression[3])(pFVar8);
      if ((char)iVar6 != '\0') {
        pPVar1 = (PString *)pFVar8[1]._vptr_FxExpression;
        if (pPVar1 == TypeString) {
          FString::AttachToOther(&local_38,(FString *)&pFVar8[1].JumpAddresses);
        }
        else {
          local_38.Chars = (char *)pFVar8[1].JumpAddresses.Array;
        }
        (*pFVar8->_vptr_FxExpression[1])(pFVar8);
        if (iVar7 == 0x13a) {
          this = (DObject *)
                 M_Malloc_Dbg(0x38,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                              ,0x1f7);
          pPVar2 = TypeSInt32;
          DObject::DObject(this);
          *(int *)&this->field_0x24 = iVar5;
          this[1]._vptr_DObject = (_func_int **)pPVar2;
          this->_vptr_DObject = (_func_int **)&PTR_StaticType_0086e9a0;
          iVar7 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
          if (iVar7 == 1) {
            iVar6 = (int)(double)local_38.Chars;
          }
          else {
            iVar6 = 0;
            if (iVar7 == 0) {
              iVar6 = (int)local_38.Chars;
            }
          }
          *(int *)&this[1].Class = iVar6;
        }
        else {
          this = (DObject *)
                 M_Malloc_Dbg(0x38,
                              "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                              ,0x1f7);
          pPVar3 = TypeFloat64;
          DObject::DObject(this);
          *(int *)&this->field_0x24 = iVar5;
          this[1]._vptr_DObject = (_func_int **)pPVar3;
          this->_vptr_DObject = (_func_int **)&PTR_StaticType_0086e9a0;
          iVar7 = (*(pPVar1->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
          FVar11.Chars = local_38.Chars;
          if ((iVar7 != 1) && (FVar11.Chars = (char *)(PClass *)0x0, iVar7 == 0)) {
            FVar11.Chars = (char *)(double)(int)local_38.Chars;
          }
          this[1].Class = (PClass *)FVar11.Chars;
        }
        pPVar9 = PSymbolTable::AddSymbol(symt,(PSymbol *)this);
        if (pPVar9 == (PSymbol *)0x0) {
          (*this->_vptr_DObject[2])(this);
          if (cls == (PClassActor *)0x0) {
            pcVar10 = "Global";
          }
          else {
            pcVar10 = FName::NameData.NameArray
                      [(cls->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text;
          }
          FScanner::ScriptMessage
                    (sc,"\'%s\' is already defined in \'%s\'.",FName::NameData.NameArray[iVar5].Text
                     ,pcVar10);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        }
        if (pPVar1 != TypeString) {
          return;
        }
        FString::~FString(&local_38);
        return;
      }
      pcVar10 = "Constant definition is not a constant";
    }
  }
  else {
    pcVar10 = "Numeric type required for constant";
  }
  FScanner::ScriptMessage(sc,pcVar10);
  FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  return;
}

Assistant:

static void ParseConstant (FScanner &sc, PSymbolTable *symt, PClassActor *cls)
{
	// Read the type and make sure it's int or float.
	if (sc.CheckToken(TK_Int) || sc.CheckToken(TK_Float))
	{
		int type = sc.TokenType;
		sc.MustGetToken(TK_Identifier);
		FName symname = sc.String;
		sc.MustGetToken('=');
		FxExpression *expr = ParseExpression (sc, cls, true);
		sc.MustGetToken(';');

		if (expr == nullptr)
		{
			sc.ScriptMessage("Error while resolving constant definition");
			FScriptPosition::ErrorCounter++;
		}
		else if (!expr->isConstant())
		{
			sc.ScriptMessage("Constant definition is not a constant");
			FScriptPosition::ErrorCounter++;
		}
		else
		{
			ExpVal val = static_cast<FxConstant *>(expr)->GetValue();
			delete expr;
			PSymbolConstNumeric *sym;
			if (type == TK_Int)
			{
				sym = new PSymbolConstNumeric(symname, TypeSInt32);
				sym->Value = val.GetInt();
			}
			else
			{
				sym = new PSymbolConstNumeric(symname, TypeFloat64);
				sym->Float = val.GetFloat();
			}
			if (symt->AddSymbol (sym) == NULL)
			{
				delete sym;
				sc.ScriptMessage ("'%s' is already defined in '%s'.",
					symname.GetChars(), cls? cls->TypeName.GetChars() : "Global");
				FScriptPosition::ErrorCounter++;
			}
		}
	}
	else
	{
		sc.ScriptMessage("Numeric type required for constant");
		FScriptPosition::ErrorCounter++;
	}
}